

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

Iterator * leveldb::NewEmptyIterator(void)

{
  EmptyIterator *this;
  long in_FS_OFFSET;
  Status local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this = (EmptyIterator *)operator_new(0x30);
  local_20.state_ = (char *)0x0;
  anon_unknown_4::EmptyIterator::EmptyIterator(this,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return &this->super_Iterator;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewEmptyIterator() { return new EmptyIterator(Status::OK()); }